

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_avx2.c
# Opt level: O3

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint64_t uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  block blockR;
  block block_tmp;
  ulong auStack_bb8 [16];
  ulong auStack_b38 [16];
  ulong auStack_ab8 [16];
  ulong auStack_a38 [16];
  ulong auStack_9b8 [16];
  ulong auStack_938 [16];
  ulong auStack_8b8 [16];
  block *local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  ulong auStack_7b0 [112];
  uint local_430 [256];
  
  auStack_8b8[9] = 0x12a780;
  memcpy(&local_830,ref_block,0x400);
  lVar11 = 0;
  do {
    puVar1 = prev_block->v + lVar11;
    uVar5 = *(uint *)((long)puVar1 + 4);
    uVar10 = puVar1[1];
    uVar6 = *(uint *)((long)puVar1 + 0xc);
    uVar7 = *(uint *)((long)&local_830 + lVar11 * 8 + 4);
    uVar8 = *(uint *)(&uStack_828 + lVar11);
    uVar9 = *(uint *)((long)&uStack_828 + lVar11 * 8 + 4);
    *(uint *)(&local_830 + lVar11) = *(uint *)(&local_830 + lVar11) ^ (uint)*puVar1;
    *(uint *)((long)&local_830 + lVar11 * 8 + 4) = uVar7 ^ uVar5;
    *(uint *)(&uStack_828 + lVar11) = uVar8 ^ (uint)uVar10;
    *(uint *)((long)&uStack_828 + lVar11 * 8 + 4) = uVar9 ^ uVar6;
    lVar11 = lVar11 + 2;
  } while (lVar11 != 0x80);
  auStack_8b8[9] = 0x12a7b7;
  memcpy(local_430,&local_830,0x400);
  if (with_xor != 0) {
    lVar11 = 0;
    do {
      puVar1 = next_block->v + lVar11;
      uVar5 = *(uint *)((long)puVar1 + 4);
      uVar10 = puVar1[1];
      uVar6 = *(uint *)((long)puVar1 + 0xc);
      uVar7 = local_430[lVar11 * 2 + 1];
      uVar8 = local_430[lVar11 * 2 + 2];
      uVar9 = local_430[lVar11 * 2 + 3];
      local_430[lVar11 * 2] = local_430[lVar11 * 2] ^ (uint)*puVar1;
      local_430[lVar11 * 2 + 1] = uVar7 ^ uVar5;
      local_430[lVar11 * 2 + 2] = uVar8 ^ (uint)uVar10;
      local_430[lVar11 * 2 + 3] = uVar9 ^ uVar6;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x80);
  }
  lVar11 = 0x78;
  do {
    uVar26 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x30);
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x10);
    uVar24 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + uVar26 + lVar3;
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x70) ^ uVar24;
    uVar12 = uVar19 >> 0x20;
    uVar19 = uVar19 << 0x20 | uVar12;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x18);
    lVar4 = *(long *)((long)auStack_8b8 + lVar11 + 0x50);
    uVar13 = (lVar4 * 2 & 0x1fffffffeU) * uVar12 + uVar19 + lVar4;
    uVar12 = (uVar26 ^ uVar13) >> 0x18;
    uVar15 = (uVar26 ^ uVar13) << 0x28 | uVar12;
    uVar25 = (uVar24 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar15 + uVar24;
    uVar19 = uVar19 ^ uVar25;
    uVar12 = uVar19 >> 0x10;
    uVar20 = uVar19 << 0x30 | uVar12;
    uVar26 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x38);
    uVar17 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + lVar3 + uVar26;
    uVar24 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x78) ^ uVar17;
    uVar19 = uVar24 >> 0x20;
    uVar21 = uVar24 << 0x20 | uVar19;
    uVar14 = (uVar13 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar20 + uVar13;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x58);
    uVar24 = (lVar3 * 2 & 0x1fffffffeU) * uVar19 + uVar21 + lVar3;
    uVar12 = (uVar26 ^ uVar24) >> 0x18;
    uVar27 = (uVar26 ^ uVar24) << 0x28 | uVar12;
    uVar18 = (uVar17 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar17 + uVar27;
    uVar21 = uVar21 ^ uVar18;
    uVar12 = uVar21 >> 0x10;
    uVar22 = uVar21 << 0x30 | uVar12;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x20);
    uVar26 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x40);
    uVar29 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + uVar26 + lVar3;
    uVar13 = *(ulong *)((long)&local_838 + lVar11) ^ uVar29;
    uVar19 = uVar13 >> 0x20;
    uVar17 = uVar13 << 0x20 | uVar19;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x60);
    uVar13 = (lVar3 * 2 & 0x1fffffffeU) * uVar19 + uVar17 + lVar3;
    uVar19 = (uVar26 ^ uVar13) >> 0x18;
    uVar21 = (uVar26 ^ uVar13) << 0x28 | uVar19;
    uVar30 = (uVar29 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar21 + uVar29;
    uVar17 = uVar17 ^ uVar30;
    uVar19 = uVar17 >> 0x10;
    uVar23 = uVar17 << 0x30 | uVar19;
    uVar16 = (uVar24 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar22 + uVar24;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x28);
    uVar26 = *(ulong *)((long)auStack_8b8 + lVar11 + 0x48);
    uVar28 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + lVar3 + uVar26;
    uVar24 = *(ulong *)((long)&local_830 + lVar11) ^ uVar28;
    uVar12 = uVar24 >> 0x20;
    uVar17 = uVar24 << 0x20 | uVar12;
    lVar3 = *(long *)((long)auStack_8b8 + lVar11 + 0x68);
    uVar24 = (lVar3 * 2 & 0x1fffffffeU) * uVar12 + uVar17 + lVar3;
    uVar12 = (uVar26 ^ uVar24) >> 0x18;
    uVar29 = (uVar26 ^ uVar24) << 0x28 | uVar12;
    uVar19 = (uVar13 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar23 + uVar13;
    uVar28 = (uVar28 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar28 + uVar29;
    uVar17 = uVar17 ^ uVar28;
    uVar26 = uVar17 >> 0x10;
    uVar13 = uVar17 << 0x30 | uVar26;
    uVar24 = (uVar24 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar24;
    uVar27 = uVar27 ^ uVar16;
    uVar26 = uVar27 << 1;
    uVar12 = (ulong)((long)uVar27 < 0);
    uVar27 = uVar26 | uVar12;
    uVar17 = (uVar25 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar25 + uVar27;
    uVar13 = uVar13 ^ uVar17;
    uVar26 = uVar13 >> 0x20;
    uVar12 = uVar13 << 0x20 | uVar26;
    uVar21 = uVar21 ^ uVar19;
    uVar13 = (uVar19 * 2 & 0x1fffffffe) * uVar26 + uVar12 + uVar19;
    uVar27 = uVar27 ^ uVar13;
    uVar26 = uVar27 >> 0x18;
    uVar27 = uVar27 << 0x28 | uVar26;
    uVar26 = (uVar17 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar17 + uVar27;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x10) = uVar26;
    uVar26 = uVar26 ^ uVar12;
    uVar19 = uVar26 >> 0x10;
    uVar25 = uVar26 << 0x30 | uVar19;
    *(ulong *)((long)&local_830 + lVar11) = uVar25;
    uVar26 = uVar21 << 1;
    uVar12 = (ulong)((long)uVar21 < 0);
    uVar17 = uVar26 | uVar12;
    uVar19 = (uVar13 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar25 + uVar13;
    uVar29 = uVar29 ^ uVar24;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x60) = uVar19;
    uVar21 = (uVar18 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar17 + uVar18;
    uVar20 = uVar20 ^ uVar21;
    uVar26 = uVar20 >> 0x20;
    uVar18 = uVar20 << 0x20 | uVar26;
    uVar19 = uVar19 ^ uVar27;
    uVar12 = (uVar24 * 2 & 0x1fffffffe) * uVar26 + uVar24 + uVar18;
    uVar17 = uVar17 ^ uVar12;
    uVar26 = uVar17 >> 0x18;
    uVar13 = uVar17 << 0x28 | uVar26;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x38) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar19 = (uVar21 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar21;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x18) = uVar19;
    uVar19 = uVar19 ^ uVar18;
    uVar26 = uVar19 >> 0x10;
    uVar19 = uVar19 << 0x30 | uVar26;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x70) = uVar19;
    uVar19 = (uVar12 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar12;
    uVar26 = uVar29 << 1;
    uVar12 = (ulong)((long)uVar29 < 0);
    uVar24 = uVar26 | uVar12;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x68) = uVar19;
    uVar19 = uVar19 ^ uVar13;
    uVar15 = uVar15 ^ uVar14;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x40) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar19 = (uVar30 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar30 + uVar24;
    uVar22 = uVar22 ^ uVar19;
    uVar26 = uVar22 >> 0x20;
    uVar12 = uVar22 << 0x20 | uVar26;
    uVar17 = (uVar14 * 2 & 0x1fffffffe) * uVar26 + uVar12 + uVar14;
    uVar24 = uVar24 ^ uVar17;
    uVar26 = uVar24 >> 0x18;
    uVar13 = uVar24 << 0x28 | uVar26;
    uVar26 = (uVar19 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar13;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x20) = uVar26;
    uVar26 = uVar26 ^ uVar12;
    uVar19 = uVar26 >> 0x10;
    uVar21 = uVar26 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x78) = uVar21;
    uVar26 = uVar15 << 1;
    uVar12 = (ulong)((long)uVar15 < 0);
    uVar24 = uVar26 | uVar12;
    uVar19 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar21 + uVar17;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x50) = uVar19;
    uVar19 = uVar19 ^ uVar13;
    uVar17 = (uVar28 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar28 + uVar24;
    uVar23 = uVar23 ^ uVar17;
    uVar26 = uVar23 >> 0x20;
    uVar13 = uVar23 << 0x20 | uVar26;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x48) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar12 = (uVar16 * 2 & 0x1fffffffe) * uVar26 + uVar13 + uVar16;
    uVar24 = uVar24 ^ uVar12;
    uVar26 = uVar24 >> 0x18;
    uVar19 = uVar24 << 0x28 | uVar26;
    uVar24 = (uVar17 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar17;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x28) = uVar24;
    uVar24 = uVar24 ^ uVar13;
    uVar26 = uVar24 >> 0x10;
    uVar13 = uVar24 << 0x30 | uVar26;
    *(ulong *)((long)&local_838 + lVar11) = uVar13;
    uVar26 = (uVar12 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar12;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x58) = uVar26;
    uVar26 = uVar26 ^ uVar19;
    *(ulong *)((long)auStack_8b8 + lVar11 + 0x30) = uVar26 << 1 | (ulong)((long)uVar26 < 0);
    lVar11 = lVar11 + 0x80;
  } while (lVar11 != 0x478);
  lVar11 = 0x388;
  do {
    uVar26 = *(ulong *)((long)auStack_ab8 + lVar11);
    uVar24 = (*(long *)((long)auStack_bb8 + lVar11) * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) +
             uVar26 + *(long *)((long)auStack_bb8 + lVar11);
    uVar19 = *(ulong *)((long)auStack_8b8 + lVar11) ^ uVar24;
    uVar12 = uVar19 >> 0x20;
    uVar19 = uVar19 << 0x20 | uVar12;
    lVar3 = *(long *)((long)auStack_bb8 + lVar11 + 8);
    uVar13 = (*(long *)((long)auStack_9b8 + lVar11) * 2 & 0x1fffffffeU) * uVar12 +
             uVar19 + *(long *)((long)auStack_9b8 + lVar11);
    uVar12 = (uVar26 ^ uVar13) >> 0x18;
    auStack_8b8[0xf] = (uVar26 ^ uVar13) << 0x28 | uVar12;
    uVar18 = (uVar24 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + auStack_8b8[0xf] + uVar24;
    uVar19 = uVar19 ^ uVar18;
    uVar12 = uVar19 >> 0x10;
    auStack_8b8[0xc] = uVar19 << 0x30 | uVar12;
    uVar26 = *(ulong *)((long)auStack_ab8 + lVar11 + 8);
    uVar17 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + lVar3 + uVar26;
    uVar24 = *(ulong *)((long)auStack_8b8 + lVar11 + 8) ^ uVar17;
    uVar19 = uVar24 >> 0x20;
    uVar21 = uVar24 << 0x20 | uVar19;
    uVar14 = (uVar13 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + auStack_8b8[0xc] + uVar13;
    lVar3 = *(long *)((long)auStack_9b8 + lVar11 + 8);
    uVar24 = (lVar3 * 2 & 0x1fffffffeU) * uVar19 + uVar21 + lVar3;
    uVar12 = (uVar26 ^ uVar24) >> 0x18;
    uVar20 = (uVar26 ^ uVar24) << 0x28 | uVar12;
    uVar16 = (uVar17 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar17 + uVar20;
    uVar21 = uVar21 ^ uVar16;
    uVar12 = uVar21 >> 0x10;
    auStack_8b8[0xd] = uVar21 << 0x30 | uVar12;
    uVar26 = *(ulong *)((long)auStack_a38 + lVar11);
    uVar29 = (*(long *)((long)auStack_b38 + lVar11) * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) +
             uVar26 + *(long *)((long)auStack_b38 + lVar11);
    uVar13 = *(ulong *)((long)&local_838 + lVar11) ^ uVar29;
    uVar19 = uVar13 >> 0x20;
    uVar17 = uVar13 << 0x20 | uVar19;
    uVar13 = (*(long *)((long)auStack_938 + lVar11) * 2 & 0x1fffffffeU) * uVar19 +
             uVar17 + *(long *)((long)auStack_938 + lVar11);
    uVar19 = (uVar26 ^ uVar13) >> 0x18;
    uVar21 = (uVar26 ^ uVar13) << 0x28 | uVar19;
    uVar23 = (uVar29 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar21 + uVar29;
    uVar17 = uVar17 ^ uVar23;
    uVar19 = uVar17 >> 0x10;
    auStack_8b8[0xe] = uVar17 << 0x30 | uVar19;
    uVar15 = (uVar24 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + auStack_8b8[0xd] + uVar24;
    auStack_8b8[0xb] = auStack_8b8[0xe] + uVar13;
    lVar3 = *(long *)((long)auStack_b38 + lVar11 + 8);
    uVar26 = *(ulong *)((long)auStack_a38 + lVar11 + 8);
    uVar22 = (lVar3 * 2 & 0x1fffffffeU) * (uVar26 & 0xffffffff) + lVar3 + uVar26;
    uVar24 = *(ulong *)((long)&local_830 + lVar11) ^ uVar22;
    uVar12 = uVar24 >> 0x20;
    uVar17 = uVar24 << 0x20 | uVar12;
    lVar3 = *(long *)((long)auStack_938 + lVar11 + 8);
    uVar24 = (lVar3 * 2 & 0x1fffffffeU) * uVar12 + uVar17 + lVar3;
    uVar12 = (uVar26 ^ uVar24) >> 0x18;
    uVar29 = (uVar26 ^ uVar24) << 0x28 | uVar12;
    uVar19 = (uVar13 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + auStack_8b8[0xb];
    uVar22 = (uVar22 * 2 & 0x1fffffffe) * (uVar12 & 0xffffffff) + uVar22 + uVar29;
    uVar17 = uVar17 ^ uVar22;
    uVar26 = uVar17 >> 0x10;
    uVar13 = uVar17 << 0x30 | uVar26;
    uVar24 = (uVar24 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar24;
    uVar20 = uVar20 ^ uVar15;
    uVar26 = uVar20 << 1;
    uVar12 = (ulong)((long)uVar20 < 0);
    uVar20 = uVar26 | uVar12;
    uVar17 = (uVar18 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar18 + uVar20;
    uVar13 = uVar13 ^ uVar17;
    uVar26 = uVar13 >> 0x20;
    uVar12 = uVar13 << 0x20 | uVar26;
    uVar21 = uVar21 ^ uVar19;
    uVar13 = (uVar19 * 2 & 0x1fffffffe) * uVar26 + uVar12 + uVar19;
    uVar20 = uVar20 ^ uVar13;
    uVar26 = uVar20 >> 0x18;
    uVar20 = uVar20 << 0x28 | uVar26;
    uVar26 = (uVar17 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar17 + uVar20;
    *(ulong *)((long)auStack_bb8 + lVar11) = uVar26;
    uVar26 = uVar26 ^ uVar12;
    uVar19 = uVar26 >> 0x10;
    uVar18 = uVar26 << 0x30 | uVar19;
    *(ulong *)((long)&local_830 + lVar11) = uVar18;
    uVar26 = uVar21 << 1;
    uVar12 = (ulong)((long)uVar21 < 0);
    uVar17 = uVar26 | uVar12;
    uVar19 = (uVar13 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar18 + uVar13;
    uVar29 = uVar29 ^ uVar24;
    *(ulong *)((long)auStack_938 + lVar11) = uVar19;
    uVar21 = (uVar16 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar17 + uVar16;
    uVar26 = (auStack_8b8[0xc] ^ uVar21) >> 0x20;
    uVar16 = (auStack_8b8[0xc] ^ uVar21) << 0x20 | uVar26;
    uVar19 = uVar19 ^ uVar20;
    uVar12 = (uVar24 * 2 & 0x1fffffffe) * uVar26 + uVar24 + uVar16;
    uVar17 = uVar17 ^ uVar12;
    uVar26 = uVar17 >> 0x18;
    uVar13 = uVar17 << 0x28 | uVar26;
    *(ulong *)((long)auStack_ab8 + lVar11 + 8) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar19 = (uVar21 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar21;
    *(ulong *)((long)auStack_bb8 + lVar11 + 8) = uVar19;
    uVar19 = uVar19 ^ uVar16;
    uVar26 = uVar19 >> 0x10;
    uVar19 = uVar19 << 0x30 | uVar26;
    *(ulong *)((long)auStack_8b8 + lVar11) = uVar19;
    uVar19 = (uVar12 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar12;
    uVar26 = uVar29 << 1;
    uVar12 = (ulong)((long)uVar29 < 0);
    uVar24 = uVar26 | uVar12;
    *(ulong *)((long)auStack_938 + lVar11 + 8) = uVar19;
    uVar19 = uVar19 ^ uVar13;
    *(ulong *)((long)auStack_a38 + lVar11) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar19 = (uVar23 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar23 + uVar24;
    uVar26 = (auStack_8b8[0xd] ^ uVar19) >> 0x20;
    uVar12 = (auStack_8b8[0xd] ^ uVar19) << 0x20 | uVar26;
    uVar17 = (uVar14 * 2 & 0x1fffffffe) * uVar26 + uVar12 + uVar14;
    uVar24 = uVar24 ^ uVar17;
    uVar26 = uVar24 >> 0x18;
    uVar13 = uVar24 << 0x28 | uVar26;
    uVar26 = (uVar19 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar13;
    *(ulong *)((long)auStack_b38 + lVar11) = uVar26;
    uVar26 = uVar26 ^ uVar12;
    uVar19 = uVar26 >> 0x10;
    uVar21 = uVar26 << 0x30 | uVar19;
    *(ulong *)((long)auStack_8b8 + lVar11 + 8) = uVar21;
    uVar26 = (auStack_8b8[0xf] ^ uVar14) << 1;
    uVar12 = (ulong)((long)(auStack_8b8[0xf] ^ uVar14) < 0);
    uVar24 = uVar26 | uVar12;
    uVar19 = (uVar17 * 2 & 0x1fffffffe) * (uVar19 & 0xffffffff) + uVar21 + uVar17;
    *(ulong *)((long)auStack_9b8 + lVar11) = uVar19;
    uVar19 = uVar19 ^ uVar13;
    uVar17 = (uVar22 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff | uVar12) + uVar22 + uVar24;
    uVar26 = (auStack_8b8[0xe] ^ uVar17) >> 0x20;
    uVar13 = (auStack_8b8[0xe] ^ uVar17) << 0x20 | uVar26;
    *(ulong *)((long)auStack_a38 + lVar11 + 8) = uVar19 << 1 | (ulong)((long)uVar19 < 0);
    uVar12 = (uVar15 * 2 & 0x1fffffffe) * uVar26 + uVar13 + uVar15;
    uVar24 = uVar24 ^ uVar12;
    uVar26 = uVar24 >> 0x18;
    uVar19 = uVar24 << 0x28 | uVar26;
    uVar24 = (uVar17 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar19 + uVar17;
    *(ulong *)((long)auStack_b38 + lVar11 + 8) = uVar24;
    uVar24 = uVar24 ^ uVar13;
    uVar26 = uVar24 >> 0x10;
    uVar13 = uVar24 << 0x30 | uVar26;
    *(ulong *)((long)&local_838 + lVar11) = uVar13;
    uVar26 = (uVar12 * 2 & 0x1fffffffe) * (uVar26 & 0xffffffff) + uVar13 + uVar12;
    *(ulong *)((long)auStack_9b8 + lVar11 + 8) = uVar26;
    uVar26 = uVar26 ^ uVar19;
    *(ulong *)((long)auStack_ab8 + lVar11) = uVar26 << 1 | (ulong)((long)uVar26 < 0);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x408);
  auStack_8b8[9] = 0x12b1d7;
  local_838 = next_block;
  memcpy(next_block,local_430,0x400);
  lVar11 = 0;
  do {
    uVar5 = *(uint *)((long)&local_830 + lVar11 * 8 + 4);
    uVar6 = *(uint *)(&uStack_828 + lVar11);
    uVar7 = *(uint *)((long)&uStack_828 + lVar11 * 8 + 4);
    puVar1 = next_block->v + lVar11;
    uVar8 = *(uint *)((long)puVar1 + 4);
    uVar10 = puVar1[1];
    uVar9 = *(uint *)((long)puVar1 + 0xc);
    puVar2 = next_block->v + lVar11;
    *(uint *)puVar2 = (uint)*puVar1 ^ *(uint *)(&local_830 + lVar11);
    *(uint *)((long)puVar2 + 4) = uVar8 ^ uVar5;
    *(uint *)(puVar2 + 1) = (uint)uVar10 ^ uVar6;
    *(uint *)((long)puVar2 + 0xc) = uVar9 ^ uVar7;
    lVar11 = lVar11 + 2;
  } while (lVar11 != 0x80);
  return;
}

Assistant:

static void fill_block(__m256i* state, const block* ref_block,
	block* next_block, int with_xor) {
	__m256i block_XY[ARGON2_HWORDS_IN_BLOCK];
	unsigned int i;

	if (with_xor) {
		for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
			state[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)ref_block->v + i));
			block_XY[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)next_block->v + i));
		}
	}
	else {
		for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
			block_XY[i] = state[i] = _mm256_xor_si256(
				state[i], _mm256_loadu_si256((const __m256i*)ref_block->v + i));
		}
	}

	for (i = 0; i < 4; ++i) {
		BLAKE2_ROUND_1(state[8 * i + 0], state[8 * i + 4], state[8 * i + 1], state[8 * i + 5],
			state[8 * i + 2], state[8 * i + 6], state[8 * i + 3], state[8 * i + 7]);
	}

	for (i = 0; i < 4; ++i) {
		BLAKE2_ROUND_2(state[0 + i], state[4 + i], state[8 + i], state[12 + i],
			state[16 + i], state[20 + i], state[24 + i], state[28 + i]);
	}

	for (i = 0; i < ARGON2_HWORDS_IN_BLOCK; i++) {
		state[i] = _mm256_xor_si256(state[i], block_XY[i]);
		_mm256_storeu_si256((__m256i*)next_block->v + i, state[i]);
	}
}